

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int local_88;
  int local_7c;
  int max;
  int count;
  uint start;
  int previousIs0;
  uint alphabetSize;
  uint symbol;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int tableSize;
  int nbBits;
  BYTE *oend;
  BYTE *out;
  BYTE *ostart;
  uint writeIsSafe_local;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  size_t headerBufferSize_local;
  void *header_local;
  
  bitCount = 1 << ((byte)tableLog & 0x1f);
  previousIs0 = 0;
  uVar1 = maxSymbolValue + 1;
  bVar5 = false;
  symbol = tableLog - 5;
  alphabetSize = 4;
  bitStream = bitCount + 1;
  remaining = tableLog + 1;
  oend = (BYTE *)header;
  while ((uint)previousIs0 < uVar1 && 1 < (int)bitStream) {
    uVar2 = alphabetSize;
    if (bVar5) {
      max = previousIs0;
      while( true ) {
        bVar5 = false;
        if ((uint)previousIs0 < uVar1) {
          bVar5 = normalizedCounter[(uint)previousIs0] == 0;
        }
        if (!bVar5) break;
        previousIs0 = previousIs0 + 1;
      }
      if (previousIs0 == uVar1) break;
      while (max + 0x18U <= (uint)previousIs0) {
        max = max + 0x18;
        uVar2 = (0xffff << ((byte)alphabetSize & 0x1f)) + symbol;
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < oend)) {
          return 0xffffffffffffffba;
        }
        *oend = (BYTE)uVar2;
        oend[1] = (BYTE)(uVar2 >> 8);
        oend = oend + 2;
        symbol = uVar2 >> 0x10;
      }
      for (; max + 3U <= (uint)previousIs0; max = max + 3) {
        symbol = (3 << ((byte)alphabetSize & 0x1f)) + symbol;
        alphabetSize = alphabetSize + 2;
      }
      symbol = (previousIs0 - max << ((byte)alphabetSize & 0x1f)) + symbol;
      uVar2 = alphabetSize + 2;
      if (0x10 < (int)(alphabetSize + 2)) {
        if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < oend)) {
          return 0xffffffffffffffba;
        }
        *oend = (BYTE)symbol;
        oend[1] = (BYTE)(symbol >> 8);
        oend = oend + 2;
        symbol = symbol >> 0x10;
        uVar2 = alphabetSize - 0xe;
      }
    }
    alphabetSize = uVar2;
    iVar4 = previousIs0 + 1;
    local_7c = (int)normalizedCounter[(uint)previousIs0];
    iVar3 = (bitCount * 2 + -1) - bitStream;
    local_88 = local_7c;
    if (local_7c < 0) {
      local_88 = -local_7c;
    }
    bitStream = bitStream - local_88;
    local_7c = local_7c + 1;
    if (bitCount <= local_7c) {
      local_7c = iVar3 + local_7c;
    }
    symbol = (local_7c << ((byte)alphabetSize & 0x1f)) + symbol;
    alphabetSize = (remaining + alphabetSize) - (uint)(local_7c < iVar3);
    bVar5 = local_7c == 1;
    if ((int)bitStream < 1) {
      return 0xffffffffffffffff;
    }
    for (; (int)bitStream < bitCount; bitCount = bitCount >> 1) {
      remaining = remaining + -1;
    }
    previousIs0 = iVar4;
    if (0x10 < (int)alphabetSize) {
      if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < oend)) {
        return 0xffffffffffffffba;
      }
      *oend = (BYTE)symbol;
      oend[1] = (BYTE)(symbol >> 8);
      oend = oend + 2;
      symbol = symbol >> 0x10;
      alphabetSize = alphabetSize - 0x10;
    }
  }
  if (bitStream == 1) {
    if (uVar1 < (uint)previousIs0) {
      __assert_fail("symbol <= alphabetSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x164e,
                    "size_t FSE_writeNCount_generic(void *, size_t, const short *, unsigned int, unsigned int, unsigned int)"
                   );
    }
    if ((writeIsSafe == 0) && ((BYTE *)((long)header + (headerBufferSize - 2)) < oend)) {
      header_local = (void *)0xffffffffffffffba;
    }
    else {
      *oend = (BYTE)symbol;
      oend[1] = (BYTE)(symbol >> 8);
      header_local = oend + ((long)((int)(alphabetSize + 7) / 8) - (long)header);
    }
  }
  else {
    header_local = (void *)0xffffffffffffffff;
  }
  return (size_t)header_local;
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}